

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::value(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *__return_storage_ptr__,
       SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this)

{
  SPxSense SVar1;
  double *pdVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_168;
  long local_130;
  long local_128;
  cpp_dec_float<50U,_int,_void> local_120;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_168.data._M_elems._32_5_ = 0;
  local_168.data._M_elems[9]._1_3_ = 0;
  local_168.exp = 0;
  local_168.neg = false;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems._24_5_ = 0;
  local_168.data._M_elems[7]._1_3_ = 0;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  if (this->initialized == false) {
    pdVar2 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&__return_storage_ptr__->m_backend,*pdVar2,(type *)0x0);
    return __return_storage_ptr__;
  }
  if (this->theRep == ROW) {
    if (this->theType == LEAVE) {
      SVar1 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesense;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_e8,
                  &this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,this->theFrhs);
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8.data._M_elems[9]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      local_120.data._M_elems._0_8_ = (long)SVar1;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&local_a8,&local_e8,(longlong *)&local_120);
      goto LAB_0021b129;
    }
    local_130 = (long)(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesense;
    nonbasicValue((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_120,this);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_68,
                &this->theCoPvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,this->theFrhs);
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_e8,&local_120,&local_68);
    local_128 = local_130;
  }
  else {
    SVar1 = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesense;
    nonbasicValue((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_120,this);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_68,
                &this->theFvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,this->theCoPrhs);
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_e8,&local_120,&local_68);
    local_128 = (long)SVar1;
  }
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.neg = false;
  local_a8.exp = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
            (&local_a8,&local_e8,&local_128);
LAB_0021b129:
  local_168.fpclass = local_a8.fpclass;
  local_168.prec_elem = local_a8.prec_elem;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  local_168.data._M_elems._0_8_ = local_a8.data._M_elems._0_8_;
  local_168.data._M_elems._8_8_ = local_a8.data._M_elems._8_8_;
  local_168.data._M_elems._16_8_ = local_a8.data._M_elems._16_8_;
  local_168.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
  local_168.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
  local_168.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
  local_168.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
  local_168.exp = local_a8.exp;
  local_168.neg = local_a8.neg;
  boost::multiprecision::default_ops::
  eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&__return_storage_ptr__->m_backend,&local_168,
             &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).offset.m_backend);
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::value()
   {
      assert(isInitialized());

      R x;

      // calling value() without having a suitable status is an error.
      if(!isInitialized())
         return R(infinity);

      if(rep() == ROW)
      {
         if(type() == LEAVE)
            x = int(SPxLPBase<R>::spxSense()) * (coPvec() *
                                                 fRhs()); // the contribution of maxRowObj() is missing
         else
            x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + (coPvec() * fRhs()));
      }
      else
         x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + fVec() * coPrhs());

      return x + this->objOffset();
   }